

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O1

void __thiscall
PSVIWriterHandlers::processDOMElement
          (PSVIWriterHandlers *this,XMLCh *encloseName,DOMElement *rootElem,XMLCh *elementName)

{
  long *plVar1;
  long lVar2;
  long *plVar3;
  XMLCh *pXVar4;
  DOMNamedNodeMap *attrs;
  ulong uVar5;
  ulong uVar6;
  
  plVar1 = (long *)(**(code **)(*(long *)rootElem + 0x1a8))
                             (rootElem,&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                              elementName);
  lVar2 = (**(code **)(*plVar1 + 0x18))(plVar1);
  if (lVar2 != 0) {
    writeOpen(this,encloseName);
    incIndent(this);
    lVar2 = (**(code **)(*plVar1 + 0x18))(plVar1);
    if (lVar2 != 0) {
      uVar6 = 0;
      do {
        plVar3 = (long *)(**(code **)(*plVar1 + 0x10))(plVar1,uVar6);
        writeOpen(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgElement);
        incIndent(this);
        pXVar4 = (XMLCh *)(**(code **)(*plVar3 + 0xb0))(plVar3);
        sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNamespaceName,pXVar4);
        pXVar4 = (XMLCh *)(**(code **)(*plVar3 + 0xc0))(plVar3);
        sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgLocalName,pXVar4);
        pXVar4 = (XMLCh *)(**(code **)(*plVar3 + 0xb8))(plVar3);
        sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgPrefix,pXVar4);
        writeOpen(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgChildren);
        incIndent(this);
        writeOpen(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgCharacter);
        incIndent(this);
        pXVar4 = (XMLCh *)(**(code **)(*plVar3 + 0x108))(plVar3);
        sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgTextContent,pXVar4);
        sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgCharacter);
        sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgChildren);
        attrs = (DOMNamedNodeMap *)(**(code **)(*plVar3 + 0x58))(plVar3);
        processDOMAttributes(this,attrs);
        sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgElement);
        uVar6 = uVar6 + 1;
        uVar5 = (**(code **)(*plVar1 + 0x18))(plVar1);
      } while (uVar6 < uVar5);
    }
    sendUnindentedElement(this,encloseName);
    return;
  }
  sendElementEmpty(this,encloseName);
  return;
}

Assistant:

void PSVIWriterHandlers::processDOMElement(const XMLCh* const encloseName, DOMElement* rootElem, const XMLCh* const elementName) {
	DOMNodeList* elems = rootElem->getElementsByTagNameNS(SchemaSymbols::fgURI_SCHEMAFORSCHEMA, elementName);
	if (elems->getLength()==0) {
		sendElementEmpty(encloseName);
	} else {
		sendIndentedElement(encloseName);
		for (XMLSize_t i=0; i < elems->getLength(); i++) {
			DOMElement* elem = (DOMElement*)elems->item(i);
			sendIndentedElement(PSVIUni::fgElement);
			sendElementValue(PSVIUni::fgNamespaceName, elem->getNamespaceURI());
			sendElementValue(PSVIUni::fgLocalName, elem->getLocalName());
			sendElementValue(PSVIUni::fgPrefix, elem->getPrefix());
			sendIndentedElement(PSVIUni::fgChildren);
			sendIndentedElement(PSVIUni::fgCharacter);
			sendElementValue(PSVIUni::fgTextContent, elem->getTextContent());
			sendUnindentedElement(PSVIUni::fgCharacter);
			sendUnindentedElement(PSVIUni::fgChildren);
			processDOMAttributes(elem->getAttributes());
			sendUnindentedElement(PSVIUni::fgElement);
		}
		sendUnindentedElement(encloseName);
	}
}